

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orderedCollection.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_orderedCollection_asArray(sysbvm_context_t *context,sysbvm_tuple_t orderedCollection)

{
  sysbvm_tuple_t array;
  _Bool _Var1;
  sysbvm_size_t size;
  sysbvm_orderedCollection_t *orderedCollectionObject;
  sysbvm_tuple_t orderedCollection_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(orderedCollection);
  if (_Var1) {
    if (*(long *)(orderedCollection + 0x18) == 0) {
      context_local = (sysbvm_context_t *)sysbvm_array_create(context,0);
    }
    else {
      array = *(sysbvm_tuple_t *)(orderedCollection + 0x18);
      size = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(orderedCollection + 0x10));
      context_local = (sysbvm_context_t *)sysbvm_array_getFirstElements(context,array,size);
    }
  }
  else {
    context_local = (sysbvm_context_t *)0x0;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_orderedCollection_asArray(sysbvm_context_t *context, sysbvm_tuple_t orderedCollection)
{
    if(!sysbvm_tuple_isNonNullPointer(orderedCollection))
        return SYSBVM_NULL_TUPLE;

    sysbvm_orderedCollection_t *orderedCollectionObject = (sysbvm_orderedCollection_t*)orderedCollection;
    if(!orderedCollectionObject->storage)
        return sysbvm_array_create(context, 0);

    return sysbvm_array_getFirstElements(context, orderedCollectionObject->storage, sysbvm_tuple_size_decode(orderedCollectionObject->size));
}